

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::GetTypedModeFunction<double,duckdb::ModeStandard<double>>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  LogicalType *in_RCX;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,(LogicalType *)this);
  duckdb::LogicalType::LogicalType(local_40,(LogicalType *)this);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,double,duckdb::ModeFunction<duckdb::ModeStandard<double>>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,in_RCX);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  __return_storage_ptr__->window =
       ModeFunction<duckdb::ModeStandard<double>>::
       Window<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,double>;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}